

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudio.c
# Opt level: O0

uint32_t FAudioVoice_SetOutputVoices(FAudioVoice *voice,FAudioVoiceSends *pSendList)

{
  code *pcVar1;
  int iVar2;
  uint32_t uVar3;
  undefined8 uVar4;
  long lVar5;
  ulong uVar6;
  uint *in_RSI;
  long *in_RDI;
  double dVar7;
  SDL_AssertState sdl_assert_state_1;
  SDL_AssertState sdl_assert_state;
  FAudioSendDescriptor defaultSend;
  FAudioVoiceSends defaultSends;
  uint64_t resampleSanityCheck;
  uint32_t newResampleSamples;
  uint32_t outSampleRate;
  uint32_t channelCount;
  uint32_t outChannels;
  uint32_t i;
  undefined8 in_stack_ffffffffffffff98;
  uint uVar8;
  undefined2 in_stack_ffffffffffffffa4;
  undefined1 in_stack_ffffffffffffffa6;
  undefined1 in_stack_ffffffffffffffa7;
  undefined4 local_50;
  undefined8 local_4c;
  uint local_44;
  undefined4 *local_40;
  ulong local_38;
  undefined4 local_2c;
  uint local_28;
  uint local_24;
  uint local_20;
  uint local_1c;
  uint *local_18;
  long *local_10;
  uint32_t local_4;
  
  if (*(int *)((long)in_RDI + 0xc) == 2) {
    local_4 = 0x88960001;
  }
  else {
    local_18 = in_RSI;
    local_10 = in_RDI;
    FAudio_PlatformLockMutex((FAudioMutex)0x122947);
    for (local_1c = 0; local_1c < *(uint *)(local_10 + 2); local_1c = local_1c + 1) {
      (**(code **)(*local_10 + 0x80))(*(undefined8 *)(local_10[4] + (ulong)local_1c * 8));
    }
    if (local_10[4] != 0) {
      (**(code **)(*local_10 + 0x80))(local_10[4]);
    }
    if (local_10[5] != 0) {
      (**(code **)(*local_10 + 0x80))(local_10[5]);
    }
    if (local_10[6] != 0) {
      (**(code **)(*local_10 + 0x80))(local_10[6]);
      local_10[6] = 0;
    }
    if (local_10[7] != 0) {
      for (local_1c = 0; local_1c < *(uint *)(local_10 + 2); local_1c = local_1c + 1) {
        if (*(long *)(local_10[7] + (ulong)local_1c * 8) != 0) {
          (**(code **)(*local_10 + 0x80))(*(undefined8 *)(local_10[7] + (ulong)local_1c * 8));
        }
      }
      (**(code **)(*local_10 + 0x80))(local_10[7]);
      local_10[7] = 0;
    }
    if (*(long *)((long)local_10 + 0x14) != 0) {
      (**(code **)(*local_10 + 0x80))(*(undefined8 *)((long)local_10 + 0x14));
    }
    if (local_18 == (uint *)0x0) {
      local_50 = 0;
      local_4c = *(undefined8 *)(*local_10 + 0x10);
      local_44 = 1;
      local_40 = &local_50;
      local_18 = &local_44;
    }
    else if (*local_18 == 0) {
      local_10[4] = 0;
      local_10[5] = 0;
      local_10[6] = 0;
      local_10[7] = 0;
      SDL_memset(local_10 + 2,0,0xc);
      FAudio_PlatformUnlockMutex((FAudioMutex)0x122b66);
      return 0;
    }
    *(uint *)(local_10 + 2) = *local_18;
    uVar4 = (**(code **)(*local_10 + 0x78))((ulong)*local_18 * 0xc);
    *(undefined8 *)((long)local_10 + 0x14) = uVar4;
    SDL_memcpy(*(undefined8 *)((long)local_10 + 0x14),*(undefined8 *)(local_18 + 1),
               (ulong)*local_18 * 0xc);
    lVar5 = (**(code **)(*local_10 + 0x78))((ulong)*local_18 << 3);
    local_10[4] = lVar5;
    lVar5 = (**(code **)(*local_10 + 0x78))((ulong)*local_18 << 3);
    local_10[5] = lVar5;
    for (local_1c = 0; uVar3 = (uint32_t)((ulong)in_stack_ffffffffffffff98 >> 0x20),
        local_1c < *local_18; local_1c = local_1c + 1) {
      if (*(int *)(*(long *)(*(long *)(local_18 + 1) + (ulong)local_1c * 0xc + 4) + 0xc) == 2) {
        local_20 = *(uint *)(*(long *)(*(long *)(local_18 + 1) + (ulong)local_1c * 0xc + 4) + 0xd0);
      }
      else {
        local_20 = *(uint *)(*(long *)(*(long *)(local_18 + 1) + (ulong)local_1c * 0xc + 4) + 0xe0);
      }
      uVar4 = (**(code **)(*local_10 + 0x78))
                        ((ulong)*(uint *)(local_10 + 0x16) * 4 * (ulong)local_20);
      *(undefined8 *)(local_10[4] + (ulong)local_1c * 8) = uVar4;
      do {
        in_stack_ffffffffffffffa7 = false;
        if ((int)local_10[0x16] != 0) {
          in_stack_ffffffffffffffa7 = *(uint *)(local_10 + 0x16) < 9;
        }
        if (((in_stack_ffffffffffffffa7 ^ 0xff) & 1) == 0) goto LAB_00122d44;
        iVar2 = SDL_ReportAssertion(&FAudioVoice_SetOutputVoices::sdl_assert_data,
                                    "FAudioVoice_SetOutputVoices",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/GloriousEggroll[P]FAudio/src/FAudio.c"
                                    ,0x3cb);
      } while (iVar2 == 0);
      if (iVar2 == 1) {
        pcVar1 = (code *)swi(3);
        uVar3 = (*pcVar1)();
        return uVar3;
      }
LAB_00122d44:
      do {
        in_stack_ffffffffffffffa6 = local_20 != 0 && local_20 < 9;
        if (local_20 != 0 && local_20 < 9) goto LAB_00122da1;
        iVar2 = SDL_ReportAssertion(&FAudioVoice_SetOutputVoices::sdl_assert_data_1,
                                    "FAudioVoice_SetOutputVoices",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/GloriousEggroll[P]FAudio/src/FAudio.c"
                                    ,0x3cc);
      } while (iVar2 == 0);
      if (iVar2 == 1) {
        pcVar1 = (code *)swi(3);
        uVar3 = (*pcVar1)();
        return uVar3;
      }
LAB_00122da1:
      SDL_memcpy(*(undefined8 *)(local_10[4] + (ulong)local_1c * 8),
                 FAUDIO_INTERNAL_MATRIX_DEFAULTS[(int)local_10[0x16] - 1] + (local_20 - 1),
                 (ulong)((int)local_10[0x16] * local_20) << 2);
      if ((int)local_10[0x16] == 1) {
        if (local_20 == 1) {
          *(code **)(local_10[5] + (ulong)local_1c * 8) = FAudio_INTERNAL_Mix_1in_1out_Scalar;
        }
        else if (local_20 == 2) {
          *(code **)(local_10[5] + (ulong)local_1c * 8) = FAudio_INTERNAL_Mix_1in_2out_Scalar;
        }
        else if (local_20 == 6) {
          *(code **)(local_10[5] + (ulong)local_1c * 8) = FAudio_INTERNAL_Mix_1in_6out_Scalar;
        }
        else if (local_20 == 8) {
          *(code **)(local_10[5] + (ulong)local_1c * 8) = FAudio_INTERNAL_Mix_1in_8out_Scalar;
        }
        else {
          *(code **)(local_10[5] + (ulong)local_1c * 8) = FAudio_INTERNAL_Mix_Generic_Scalar;
        }
      }
      else if ((int)local_10[0x16] == 2) {
        if (local_20 == 1) {
          *(code **)(local_10[5] + (ulong)local_1c * 8) = FAudio_INTERNAL_Mix_2in_1out_Scalar;
        }
        else if (local_20 == 2) {
          *(code **)(local_10[5] + (ulong)local_1c * 8) = FAudio_INTERNAL_Mix_2in_2out_Scalar;
        }
        else if (local_20 == 6) {
          *(code **)(local_10[5] + (ulong)local_1c * 8) = FAudio_INTERNAL_Mix_2in_6out_Scalar;
        }
        else if (local_20 == 8) {
          *(code **)(local_10[5] + (ulong)local_1c * 8) = FAudio_INTERNAL_Mix_2in_8out_Scalar;
        }
        else {
          *(code **)(local_10[5] + (ulong)local_1c * 8) = FAudio_INTERNAL_Mix_Generic_Scalar;
        }
      }
      else {
        *(code **)(local_10[5] + (ulong)local_1c * 8) = FAudio_INTERNAL_Mix_Generic_Scalar;
      }
      if ((*(uint *)(*(long *)(local_18 + 1) + (ulong)local_1c * 0xc) & 0x80) != 0) {
        if (local_10[6] == 0) {
          lVar5 = (**(code **)(*local_10 + 0x78))((ulong)*local_18 * 0xc);
          local_10[6] = lVar5;
        }
        if (local_10[7] == 0) {
          lVar5 = (**(code **)(*local_10 + 0x78))((ulong)*local_18 << 3);
          local_10[7] = lVar5;
          SDL_memset(local_10[7],0,(ulong)*local_18 << 3);
        }
        *(undefined4 *)(local_10[6] + (ulong)local_1c * 0xc) = 0;
        *(undefined4 *)(local_10[6] + (ulong)local_1c * 0xc + 4) = 0x3f800000;
        *(undefined4 *)(local_10[6] + (ulong)local_1c * 0xc + 8) = 0x3f800000;
        uVar4 = (**(code **)(*local_10 + 0x78))((ulong)local_20 << 4);
        *(undefined8 *)(local_10[7] + (ulong)local_1c * 8) = uVar4;
        SDL_memset(*(undefined8 *)(local_10[7] + (ulong)local_1c * 8),0,(ulong)local_20 << 4);
      }
    }
    if (*(int *)(*(long *)(*(long *)((long)local_10 + 0x14) + 4) + 0xc) == 2) {
      uVar8 = *(uint *)(*(long *)(*(long *)((long)local_10 + 0x14) + 4) + 0xd4);
    }
    else {
      uVar8 = *(uint *)(*(long *)(*(long *)((long)local_10 + 0x14) + 4) + 0xe4);
    }
    local_28 = uVar8;
    dVar7 = (double)SDL_ceil(((double)*(uint *)(*local_10 + 8) * (double)uVar8) /
                             (double)*(uint *)(*(long *)(*local_10 + 0x10) + 0xd4));
    local_2c = (undefined4)(long)dVar7;
    if (*(int *)((long)local_10 + 0xc) == 0) {
      local_24 = (uint)*(ushort *)(local_10[0x1e] + 2);
    }
    else if (*(int *)((long)local_10 + 0xc) == 1) {
      local_24 = *(uint *)(local_10 + 0x1c);
    }
    else if (*(int *)((long)local_10 + 0xc) == 2) {
      local_24 = *(uint *)(local_10 + 0x1a);
    }
    FAudio_INTERNAL_ResizeResampleCache
              ((FAudio *)
               CONCAT17(in_stack_ffffffffffffffa7,
                        CONCAT16(in_stack_ffffffffffffffa6,CONCAT24(in_stack_ffffffffffffffa4,uVar8)
                                )),uVar3);
    if (*(int *)((long)local_10 + 0xc) == 0) {
      *(undefined4 *)((long)local_10 + 0xc4) = local_2c;
    }
    else {
      *(undefined4 *)((long)local_10 + 0xc4) = local_2c;
      dVar7 = ((double)*(uint *)((long)local_10 + 0xe4) / (double)local_28) * 4294967296.0 + 0.5;
      uVar6 = (ulong)dVar7;
      local_10[0x1a] = uVar6 | (long)(dVar7 - 9.223372036854776e+18) & (long)uVar6 >> 0x3f;
      local_38 = local_10[0x1a] * (ulong)*(uint *)((long)local_10 + 0xc4) >> 0x20;
      if ((ulong)*(uint *)(local_10 + 0x18) / (ulong)*(uint *)(local_10 + 0x1c) < local_38) {
        *(int *)((long)local_10 + 0xc4) = *(int *)((long)local_10 + 0xc4) + -1;
      }
      if ((int)local_10[0x1c] == 1) {
        local_10[0x1b] = (long)FAudio_INTERNAL_ResampleMono;
      }
      else if ((int)local_10[0x1c] == 2) {
        local_10[0x1b] = (long)FAudio_INTERNAL_ResampleStereo;
      }
      else {
        local_10[0x1b] = (long)FAudio_INTERNAL_ResampleGeneric;
      }
    }
    FAudio_PlatformUnlockMutex((FAudioMutex)0x123358);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

uint32_t FAudioVoice_SetOutputVoices(
	FAudioVoice *voice,
	const FAudioVoiceSends *pSendList
) {
	uint32_t i;
	uint32_t outChannels;
	uint32_t channelCount;
	uint32_t outSampleRate;
	uint32_t newResampleSamples;
	uint64_t resampleSanityCheck;
	FAudioVoiceSends defaultSends;
	FAudioSendDescriptor defaultSend;

	LOG_API_ENTER(voice->audio)

	if (voice->type == FAUDIO_VOICE_MASTER)
	{
		LOG_API_EXIT(voice->audio)
		return FAUDIO_E_INVALID_CALL;
	}

	FAudio_PlatformLockMutex(voice->sendLock);
	LOG_MUTEX_LOCK(voice->audio, voice->sendLock)

	/* FIXME: This is lazy... */
	for (i = 0; i < voice->sends.SendCount; i += 1)
	{
		voice->audio->pFree(voice->sendCoefficients[i]);
	}
	if (voice->sendCoefficients != NULL)
	{
		voice->audio->pFree(voice->sendCoefficients);
	}
	if (voice->sendMix != NULL)
	{
		voice->audio->pFree(voice->sendMix);
	}
	if (voice->sendFilter != NULL)
	{
		voice->audio->pFree(voice->sendFilter);
		voice->sendFilter = NULL;
	}
	if (voice->sendFilterState != NULL)
	{
		for (i = 0; i < voice->sends.SendCount; i += 1)
		{
			if (voice->sendFilterState[i] != NULL)
			{
				voice->audio->pFree(voice->sendFilterState[i]);
			}
		}
		voice->audio->pFree(voice->sendFilterState);
		voice->sendFilterState = NULL;
	}
	if (voice->sends.pSends != NULL)
	{
		voice->audio->pFree(voice->sends.pSends);
	}

	if (pSendList == NULL)
	{
		/* Default to the mastering voice as output */
		defaultSend.Flags = 0;
		defaultSend.pOutputVoice = voice->audio->master;
		defaultSends.SendCount = 1;
		defaultSends.pSends = &defaultSend;
		pSendList = &defaultSends;
	}
	else if (pSendList->SendCount == 0)
	{
		/* No sends? Nothing to do... */
		voice->sendCoefficients = NULL;
		voice->sendMix = NULL;
		voice->sendFilter = NULL;
		voice->sendFilterState = NULL;
		FAudio_zero(&voice->sends, sizeof(FAudioVoiceSends));
		FAudio_PlatformUnlockMutex(voice->sendLock);
		LOG_MUTEX_UNLOCK(voice->audio, voice->sendLock)

		LOG_API_EXIT(voice->audio)
		return 0;
	}

	/* Copy send list */
	voice->sends.SendCount = pSendList->SendCount;
	voice->sends.pSends = (FAudioSendDescriptor*) voice->audio->pMalloc(
		pSendList->SendCount * sizeof(FAudioSendDescriptor)
	);
	FAudio_memcpy(
		voice->sends.pSends,
		pSendList->pSends,
		pSendList->SendCount * sizeof(FAudioSendDescriptor)
	);

	/* Allocate/Reset default output matrix, mixer function, filters */
	voice->sendCoefficients = (float**) voice->audio->pMalloc(
		sizeof(float*) * pSendList->SendCount
	);
	voice->sendMix = (FAudioMixCallback*) voice->audio->pMalloc(
		sizeof(FAudioMixCallback) * pSendList->SendCount
	);
	for (i = 0; i < pSendList->SendCount; i += 1)
	{
		if (pSendList->pSends[i].pOutputVoice->type == FAUDIO_VOICE_MASTER)
		{
			outChannels = pSendList->pSends[i].pOutputVoice->master.inputChannels;
		}
		else
		{
			outChannels = pSendList->pSends[i].pOutputVoice->mix.inputChannels;
		}
		voice->sendCoefficients[i] = (float*) voice->audio->pMalloc(
			sizeof(float) * voice->outputChannels * outChannels
		);

		FAudio_assert(voice->outputChannels > 0 && voice->outputChannels < 9);
		FAudio_assert(outChannels > 0 && outChannels < 9);
		FAudio_memcpy(
			voice->sendCoefficients[i],
			FAUDIO_INTERNAL_MATRIX_DEFAULTS[voice->outputChannels - 1][outChannels - 1],
			voice->outputChannels * outChannels * sizeof(float)
		);

		if (voice->outputChannels == 1)
		{
			if (outChannels == 1)
			{
				voice->sendMix[i] = FAudio_INTERNAL_Mix_1in_1out_Scalar;
			}
			else if (outChannels == 2)
			{
				voice->sendMix[i] = FAudio_INTERNAL_Mix_1in_2out_Scalar;
			}
			else if (outChannels == 6)
			{
				voice->sendMix[i] = FAudio_INTERNAL_Mix_1in_6out_Scalar;
			}
			else if (outChannels == 8)
			{
				voice->sendMix[i] = FAudio_INTERNAL_Mix_1in_8out_Scalar;
			}
			else
			{
				voice->sendMix[i] = FAudio_INTERNAL_Mix_Generic_Scalar;
			}
		}
		else if (voice->outputChannels == 2)
		{
			if (outChannels == 1)
			{
				voice->sendMix[i] = FAudio_INTERNAL_Mix_2in_1out_Scalar;
			}
			else if (outChannels == 2)
			{
				voice->sendMix[i] = FAudio_INTERNAL_Mix_2in_2out_Scalar;
			}
			else if (outChannels == 6)
			{
				voice->sendMix[i] = FAudio_INTERNAL_Mix_2in_6out_Scalar;
			}
			else if (outChannels == 8)
			{
				voice->sendMix[i] = FAudio_INTERNAL_Mix_2in_8out_Scalar;
			}
			else
			{
				voice->sendMix[i] = FAudio_INTERNAL_Mix_Generic_Scalar;
			}
		}
		else
		{
			voice->sendMix[i] = FAudio_INTERNAL_Mix_Generic_Scalar;
		}

		if (pSendList->pSends[i].Flags & FAUDIO_SEND_USEFILTER)
		{
			/* Allocate the whole send filter array if needed... */
			if (voice->sendFilter == NULL)
			{
				voice->sendFilter = (FAudioFilterParameters*) voice->audio->pMalloc(
					sizeof(FAudioFilterParameters) * pSendList->SendCount
				);
			}
			if (voice->sendFilterState == NULL)
			{
				voice->sendFilterState = (FAudioFilterState**) voice->audio->pMalloc(
					sizeof(FAudioFilterState*) * pSendList->SendCount
				);
				FAudio_zero(
					voice->sendFilterState,
					sizeof(FAudioFilterState*) * pSendList->SendCount
				);
			}

			/* ... then fill in this send's filter data */
			voice->sendFilter[i].Type = FAUDIO_DEFAULT_FILTER_TYPE;
			voice->sendFilter[i].Frequency = FAUDIO_DEFAULT_FILTER_FREQUENCY;
			voice->sendFilter[i].OneOverQ = FAUDIO_DEFAULT_FILTER_ONEOVERQ;
			voice->sendFilterState[i] = (FAudioFilterState*) voice->audio->pMalloc(
				sizeof(FAudioFilterState) * outChannels
			);
			FAudio_zero(
				voice->sendFilterState[i],
				sizeof(FAudioFilterState) * outChannels
			);
		}
	}

	/* Allocate resample cache */
	outSampleRate = voice->sends.pSends[0].pOutputVoice->type == FAUDIO_VOICE_MASTER ?
		voice->sends.pSends[0].pOutputVoice->master.inputSampleRate :
		voice->sends.pSends[0].pOutputVoice->mix.inputSampleRate;
	newResampleSamples = (uint32_t) FAudio_ceil(
		voice->audio->updateSize *
		(double) outSampleRate /
		(double) voice->audio->master->master.inputSampleRate
	);
	if (voice->type == FAUDIO_VOICE_SOURCE)
	{
		channelCount = voice->src.format->nChannels;
	}
	else if (voice->type == FAUDIO_VOICE_SUBMIX)
	{
		channelCount = voice->mix.inputChannels;
	}
	else if (voice->type == FAUDIO_VOICE_MASTER)
	{
		channelCount = voice->master.inputChannels;
	}
	FAudio_INTERNAL_ResizeResampleCache(
		voice->audio,
		newResampleSamples * channelCount
	);
	if (voice->type == FAUDIO_VOICE_SOURCE)
	{
		voice->src.resampleSamples = newResampleSamples;
	}
	else
	{
		voice->mix.outputSamples = newResampleSamples;

		voice->mix.resampleStep = DOUBLE_TO_FIXED((
			(double) voice->mix.inputSampleRate /
			(double) outSampleRate
		));

		/* Because we used ceil earlier, there's a chance that
		 * downsampling submixes will go past the number of samples
		 * available. Sources can do this thanks to padding, but we
		 * don't have that luxury for submixes, so unfortunately we
		 * just have to undo the ceil and turn it into a floor.
		 * -flibit
		 */
		resampleSanityCheck = (
			voice->mix.resampleStep * voice->mix.outputSamples
		) >> FIXED_PRECISION;
		if (resampleSanityCheck > (voice->mix.inputSamples / voice->mix.inputChannels))
		{
			voice->mix.outputSamples -= 1;
		}

		if (voice->mix.inputChannels == 1)
		{
			voice->mix.resample = FAudio_INTERNAL_ResampleMono;
		}
		else if (voice->mix.inputChannels == 2)
		{
			voice->mix.resample = FAudio_INTERNAL_ResampleStereo;
		}
		else
		{
			voice->mix.resample = FAudio_INTERNAL_ResampleGeneric;
		}
	}

	FAudio_PlatformUnlockMutex(voice->sendLock);
	LOG_MUTEX_UNLOCK(voice->audio, voice->sendLock)
	LOG_API_EXIT(voice->audio)
	return 0;
}